

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

pair<HighsImplications::VarBound_*,_bool> __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<3>::insert_entry
          (InnerLeaf<3> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  ulong uVar1;
  byte bVar2;
  double dVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  unsigned_long *puVar8;
  undefined8 uVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  pair<HighsImplications::VarBound_*,_bool> pVar13;
  int local_1c;
  
  uVar12 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  bVar2 = (byte)(uVar12 >> 10);
  uVar1 = (this->occupation).occupation;
  lVar4 = POPCOUNT(uVar1 >> (bVar2 & 0x3f));
  local_1c = (int)lVar4;
  if ((uVar1 >> (uVar12 >> 10 & 0x3f) & 1) == 0) {
    (this->occupation).occupation = uVar1 | 1L << (bVar2 & 0x3f);
    if (local_1c < this->size) {
      iVar5 = local_1c + -1;
      puVar8 = (this->hashes)._M_elems + local_1c;
      do {
        iVar5 = iVar5 + 1;
        uVar1 = *puVar8;
        puVar8 = puVar8 + 1;
        local_1c = iVar5;
      } while ((uVar12 & 0xffff) < uVar1);
    }
  }
  else {
    lVar11 = (ulong)(uint)(local_1c * 8) * -3 + -0x118;
    do {
      lVar7 = lVar4;
      lVar11 = lVar11 + -0x18;
      lVar4 = lVar7 + 1;
    } while ((uVar12 & 0xffff) < (this->hashes)._M_elems[lVar7 + -1]);
    lVar7 = lVar7 + -1;
    iVar6 = (int)lVar7;
    iVar5 = this->size;
    local_1c = iVar6;
    if (iVar5 + 2 != (int)lVar4) {
      piVar10 = (int *)((long)this - lVar11);
      do {
        local_1c = iVar6;
        if ((this->hashes)._M_elems[lVar4 + -2] != (uVar12 & 0xffff)) break;
        if (entry->key_ == *piVar10) {
          puVar8 = (this->hashes)._M_elems + (long)iVar6 * 3 + -2;
          uVar9 = 0;
          goto LAB_002ac83f;
        }
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + 1;
        piVar10 = piVar10 + 6;
        iVar6 = (int)lVar7;
        local_1c = iVar5;
      } while (iVar5 + 2 != (int)lVar4);
    }
  }
  if (local_1c < this->size) {
    move_backward(this,&local_1c,&this->size);
  }
  puVar8 = (this->hashes)._M_elems + (long)local_1c * 3 + -2;
  puVar8[0x2b] = (unsigned_long)(entry->value_).constant;
  dVar3 = (entry->value_).coef;
  puVar8[0x29] = *(undefined8 *)entry;
  puVar8[0x2a] = (unsigned_long)dVar3;
  (this->hashes)._M_elems[local_1c] = uVar12 & 0xffff;
  iVar5 = this->size;
  lVar4 = (long)iVar5 + 1;
  this->size = (int)lVar4;
  (this->hashes)._M_elems[(long)iVar5 + 1] = 0;
  uVar9 = CONCAT71((int7)((ulong)lVar4 >> 8),1);
LAB_002ac83f:
  pVar13.first = (VarBound *)(puVar8 + 0x2a);
  pVar13._8_8_ = uVar9;
  return pVar13;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }